

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.c
# Opt level: O3

void xbgr_8888_to_abgr_8888_le
               (void *src,int src_pitch,void *dst,int dst_pitch,int sx,int sy,int dx,int dy,
               int width,int height)

{
  uint *puVar1;
  uint *puVar2;
  uint *puVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  
  if (0 < height) {
    puVar3 = (uint *)((long)dst + (long)dx * 4 + (long)(dy * dst_pitch));
    iVar4 = dst_pitch + 3;
    if (-1 < dst_pitch) {
      iVar4 = dst_pitch;
    }
    iVar6 = src_pitch + 3;
    if (-1 < src_pitch) {
      iVar6 = src_pitch;
    }
    puVar2 = (uint *)((long)src + (long)sx * 4 + (long)(sy * src_pitch));
    iVar5 = 0;
    do {
      if (0 < width) {
        puVar1 = puVar3 + width;
        do {
          *puVar3 = *puVar2 | 0xff000000;
          puVar3 = puVar3 + 1;
          puVar2 = puVar2 + 1;
        } while (puVar3 < puVar1);
      }
      puVar2 = puVar2 + ((iVar6 >> 2) - width);
      puVar3 = puVar3 + ((iVar4 >> 2) - width);
      iVar5 = iVar5 + 1;
    } while (iVar5 != height);
  }
  return;
}

Assistant:

static void xbgr_8888_to_abgr_8888_le(const void *src, int src_pitch,
   void *dst, int dst_pitch,
   int sx, int sy, int dx, int dy, int width, int height)
{
   int y;
   const uint32_t *src_ptr = (const uint32_t *)((const char *)src + sy * src_pitch);
   uint32_t *dst_ptr = (void *)((char *)dst + dy * dst_pitch);
   int src_gap = src_pitch / 4 - width;
   int dst_gap = dst_pitch / 4 - width;
   src_ptr += sx;
   dst_ptr += dx;
   for (y = 0; y < height; y++) {
      uint32_t *dst_end = dst_ptr + width;
      while (dst_ptr < dst_end) {
         *dst_ptr = ALLEGRO_CONVERT_XBGR_8888_TO_ABGR_8888_LE(*src_ptr);
         dst_ptr++;
         src_ptr++;
      }
      src_ptr += src_gap;
      dst_ptr += dst_gap;
   }
}